

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O1

int Psr_ManReadSignal(Psr_Man_t *p)

{
  undefined1 *puVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  byte bVar8;
  byte *pbVar9;
  uint Value;
  uint extraout_EDX;
  uint extraout_EDX_00;
  ulong uVar10;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  Vec_Int_t *p_00;
  byte *pbVar11;
  char *pcVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  
  pbVar11 = (byte *)p->pLimit;
  pbVar9 = (byte *)p->pCur;
  if (pbVar9 < pbVar11) {
    while( true ) {
      while( true ) {
        uVar10 = (ulong)*pbVar9;
        if (0x2f < uVar10) goto LAB_003317e8;
        if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) break;
        pbVar9 = pbVar9 + 1;
        p->pCur = (char *)pbVar9;
      }
      if (uVar10 != 0x2f) break;
      if (pbVar9[1] != 0x2a) {
        if (pbVar9[1] == 0x2f) {
          pbVar9 = pbVar9 + 2;
          p->pCur = (char *)pbVar9;
          if (pbVar9 < pbVar11) {
            while (*pbVar9 != 10) {
              pbVar9 = pbVar9 + 1;
              p->pCur = (char *)pbVar9;
              if (pbVar9 == pbVar11) goto LAB_003317e8;
            }
            pbVar9 = pbVar9 + 1;
            goto LAB_00331782;
          }
        }
        goto LAB_003317e8;
      }
      pbVar9 = pbVar9 + 2;
      p->pCur = (char *)pbVar9;
      if (pbVar11 <= pbVar9) goto LAB_003317e8;
      while ((*pbVar9 != 0x2a || (pbVar9[1] != 0x2f))) {
        pbVar9 = pbVar9 + 1;
        p->pCur = (char *)pbVar9;
        if (pbVar9 == pbVar11) goto LAB_003317e8;
      }
      pbVar9 = pbVar9 + 2;
LAB_00331782:
      p->pCur = (char *)pbVar9;
      if (pbVar11 <= pbVar9) goto LAB_00331796;
    }
    if (uVar10 == 0) goto LAB_00331796;
LAB_003317e8:
    pbVar11 = (byte *)p->pCur;
    bVar3 = *pbVar11;
    if (0xf5 < (byte)(bVar3 - 0x3a)) {
      pbVar9 = pbVar11 + 1;
      do {
        pbVar7 = pbVar9;
        p->pCur = (char *)pbVar7;
        pbVar9 = pbVar7 + 1;
      } while (0xf5 < (byte)(*pbVar7 - 0x3a));
      if (*pbVar7 == 0x27) {
        p->pCur = (char *)pbVar9;
        bVar3 = *pbVar9;
        if (bVar3 == 0x68) {
          p->pCur = (char *)(pbVar7 + 2);
          puVar1 = &p->pNtk->field_0x4;
          *puVar1 = *puVar1 | 4;
          bVar3 = *p->pCur;
          while ((0xf5 < (byte)(bVar3 - 0x3a) || (0xf9 < (byte)((bVar3 & 0xdf) + 0xb9)))) {
            if (bVar3 != 0x30) {
              puVar1 = &p->pNtk->field_0x4;
              *puVar1 = *puVar1 | 8;
            }
            pcVar12 = p->pCur;
            p->pCur = pcVar12 + 1;
            bVar3 = pcVar12[1];
          }
        }
        else {
          if (bVar3 != 100) {
            if (bVar3 == 0x62) {
              do {
                pcVar12 = p->pCur;
                p->pCur = pcVar12 + 1;
                bVar3 = pcVar12[1];
                if (bVar3 < 0x78) {
                  bVar8 = 4;
                  if (bVar3 != 0x30) {
                    if (bVar3 != 0x31) goto LAB_00331b24;
                    bVar8 = 8;
                  }
                }
                else if (bVar3 == 0x78) {
                  bVar8 = 0x10;
                }
                else {
                  if (bVar3 != 0x7a) goto LAB_00331b24;
                  bVar8 = 0x20;
                }
                puVar1 = &p->pNtk->field_0x4;
                *puVar1 = *puVar1 | bVar8;
              } while( true );
            }
            if (p->ErrorStr[0] != '\0') goto LAB_00331e98;
            builtin_strncpy(p->ErrorStr,"Cannot read radix of constant.",0x1f);
            goto LAB_003318f9;
          }
          p->pCur = (char *)(pbVar7 + 2);
          puVar1 = &p->pNtk->field_0x4;
          *puVar1 = *puVar1 | 4;
          cVar2 = *p->pCur;
          while (0xf5 < (byte)(cVar2 - 0x3aU)) {
            if (cVar2 != '0') {
              puVar1 = &p->pNtk->field_0x4;
              *puVar1 = *puVar1 | 8;
            }
            pcVar12 = p->pCur;
            p->pCur = pcVar12 + 1;
            cVar2 = pcVar12[1];
          }
        }
LAB_00331b24:
        iVar5 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar11,p->pCur,(int *)0x0);
      }
      else {
        if (p->ErrorStr[0] != '\0') goto LAB_00331e98;
        builtin_strncpy(p->ErrorStr,"Cannot read constant.",0x16);
LAB_003318f9:
        iVar5 = 0;
      }
      if (iVar5 == 0) {
        if (p->ErrorStr[0] != '\0') goto LAB_00331e98;
        uVar13._0_1_ = ' ';
        uVar13._1_1_ = '9';
        uVar13._2_1_ = '.';
        uVar13._3_1_ = '\0';
        goto LAB_003317e0;
      }
      pbVar11 = (byte *)p->pLimit;
      pbVar9 = (byte *)p->pCur;
      do {
        if (pbVar11 <= pbVar9) {
LAB_00331d2e:
          if (p->ErrorStr[0] == '\0') {
            builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
            if (p->ErrorStr[0] == '\0') {
              uVar14._0_1_ = ' ';
              uVar14._1_1_ = '1';
              uVar14._2_1_ = '0';
              uVar14._3_1_ = '.';
LAB_00331dd2:
              p->ErrorStr[0] = 'E';
              p->ErrorStr[1] = 'r';
              p->ErrorStr[2] = 'r';
              p->ErrorStr[3] = 'o';
              p->ErrorStr[4] = 'r';
              p->ErrorStr[5] = ' ';
              p->ErrorStr[6] = 'n';
              p->ErrorStr[7] = 'u';
              p->ErrorStr[8] = 'm';
              p->ErrorStr[9] = 'b';
              p->ErrorStr[10] = 'e';
              p->ErrorStr[0xb] = 'r';
              *(undefined4 *)(p->ErrorStr + 0xc) = uVar14;
              p->ErrorStr[0x10] = '\0';
              return 0;
            }
          }
          goto LAB_00331e98;
        }
        while( true ) {
          uVar10 = (ulong)*pbVar9;
          if (0x2f < uVar10) goto LAB_00331d7a;
          if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) break;
          pbVar9 = pbVar9 + 1;
          p->pCur = (char *)pbVar9;
        }
        if (uVar10 != 0x2f) {
          if (uVar10 != 0) goto LAB_00331d7a;
          goto LAB_00331d2e;
        }
        if (pbVar9[1] == 0x2a) {
          pbVar9 = pbVar9 + 2;
          p->pCur = (char *)pbVar9;
          if (pbVar11 <= pbVar9) goto LAB_00331d7a;
          while ((*pbVar9 != 0x2a || (pbVar9[1] != 0x2f))) {
            pbVar9 = pbVar9 + 1;
            p->pCur = (char *)pbVar9;
            if (pbVar9 == pbVar11) goto LAB_00331d7a;
          }
          pbVar9 = pbVar9 + 2;
        }
        else {
          if (pbVar9[1] != 0x2f) {
LAB_00331d7a:
            return iVar5 * 4 + 2;
          }
          pbVar9 = pbVar9 + 2;
          p->pCur = (char *)pbVar9;
          if (pbVar11 <= pbVar9) goto LAB_00331d7a;
          while (*pbVar9 != 10) {
            pbVar9 = pbVar9 + 1;
            p->pCur = (char *)pbVar9;
            if (pbVar9 == pbVar11) goto LAB_00331d7a;
          }
          pbVar9 = pbVar9 + 1;
        }
        p->pCur = (char *)pbVar9;
      } while( true );
    }
    if (bVar3 == 0x5c) {
      pbVar11 = pbVar11 + 1;
      pbVar9 = pbVar11;
      do {
        p->pCur = (char *)pbVar9;
        bVar3 = *pbVar9;
        pbVar9 = pbVar9 + 1;
      } while (bVar3 != 0x20);
    }
    else {
      if (bVar3 == 0x7b) {
        if (p->fUsingTemp2 != 0) {
          if (p->ErrorStr[0] == '\0') {
            builtin_strncpy(p->ErrorStr,"Cannot read nested concatenations.",0x23);
            return 0;
          }
          goto LAB_00331e98;
        }
        p->fUsingTemp2 = 1;
        if (*pbVar11 != 0x7b) {
          __assert_fail("Psr_ManIsChar(p, \'{\')",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacReadVer.c"
                        ,0x192,"int Psr_ManReadConcat(Psr_Man_t *, Vec_Int_t *)");
        }
        p->pCur = (char *)(pbVar11 + 1);
        iVar5 = 0;
        iVar4 = Psr_ManReadSignalList(p,&p->vTemp2,'}',0);
        if (iVar4 == 0) {
          Psr_ManErrorSet(p,"Error number 7.",(int)extraout_RDX);
          uVar10 = extraout_RDX_00;
        }
        else {
          if (*p->pCur != '}') {
            __assert_fail("Psr_ManIsChar(p, \'}\')",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacReadVer.c"
                          ,0x196,"int Psr_ManReadConcat(Psr_Man_t *, Vec_Int_t *)");
          }
          p->pCur = p->pCur + 1;
          iVar5 = (p->vTemp2).nSize;
          if (iVar5 < 1) {
            __assert_fail("Vec_IntSize(vTemp2) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacReadVer.c"
                          ,0x199,"int Psr_ManReadConcat(Psr_Man_t *, Vec_Int_t *)");
          }
          if (iVar5 == 1) {
            iVar5 = *(p->vTemp2).pArray;
            uVar10 = extraout_RDX;
          }
          else {
            iVar5 = Psr_NtkAddConcat(p->pNtk,&p->vTemp2);
            iVar5 = iVar5 * 4 + 3;
            uVar10 = extraout_RDX_01;
          }
        }
        Value = (uint)uVar10;
        p->fUsingTemp2 = 0;
        if (iVar5 == 0) {
          pcVar12 = "Error number 11.";
          goto LAB_00331e8b;
        }
        pbVar11 = (byte *)p->pLimit;
        pbVar9 = (byte *)p->pCur;
        goto LAB_00331c76;
      }
      if ((bVar3 != 0x5f) && (iVar5 = 0, (byte)((bVar3 & 0xdf) + 0xa5) < 0xe6)) goto LAB_0033195f;
      pbVar9 = pbVar11 + 1;
      do {
        do {
          p->pCur = (char *)pbVar9;
          bVar3 = *pbVar9;
          pbVar9 = pbVar9 + 1;
        } while (0xf5 < (byte)(bVar3 - 0x3a));
      } while (((bVar3 == 0x24) || (bVar3 == 0x5f)) || (0xe5 < (byte)((bVar3 & 0xdf) + 0xa5)));
    }
    iVar5 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar11,p->pCur,(int *)0x0);
LAB_0033195f:
    if (iVar5 == 0) {
      if (p->ErrorStr[0] == '\0') {
        uVar14._0_1_ = ' ';
        uVar14._1_1_ = '1';
        uVar14._2_1_ = '3';
        uVar14._3_1_ = '.';
        goto LAB_00331dd2;
      }
      goto LAB_00331e98;
    }
    pbVar11 = (byte *)p->pLimit;
    pbVar9 = (byte *)p->pCur;
    do {
      if (pbVar11 <= pbVar9) {
LAB_00331d88:
        if (p->ErrorStr[0] == '\0') {
          builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
          if (p->ErrorStr[0] != '\0') goto LAB_00331e98;
          uVar14._0_1_ = ' ';
          uVar14._1_1_ = '1';
          uVar14._2_1_ = '4';
          uVar14._3_1_ = '.';
          goto LAB_00331dd2;
        }
        goto LAB_00331e98;
      }
      while( true ) {
        uVar10 = (ulong)*pbVar9;
        if (0x2f < uVar10) goto LAB_00331de8;
        if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) break;
        pbVar9 = pbVar9 + 1;
        p->pCur = (char *)pbVar9;
      }
      if (uVar10 != 0x2f) {
        if (uVar10 == 0) goto LAB_00331d88;
LAB_00331de8:
        if (*p->pCur != '[') {
          return iVar5 << 2;
        }
        iVar4 = Psr_ManReadRange(p);
        if (iVar4 == 0) {
          pcVar12 = "Error number 15.";
          Value = extraout_EDX;
        }
        else {
          iVar6 = Psr_ManUtilSkipSpaces(p);
          if (iVar6 == 0) {
            iVar6 = (p->pNtk->vSlices).nSize;
            p_00 = &p->pNtk->vSlices;
            Vec_IntPush(p_00,iVar5);
            Vec_IntPush(p_00,iVar4);
            return iVar6 * 4 + 1;
          }
          pcVar12 = "Error number 16.";
          Value = extraout_EDX_00;
        }
        goto LAB_00331e8b;
      }
      if (pbVar9[1] != 0x2a) {
        if (pbVar9[1] == 0x2f) {
          pbVar9 = pbVar9 + 2;
          p->pCur = (char *)pbVar9;
          if (pbVar9 < pbVar11) {
            while (*pbVar9 != 10) {
              pbVar9 = pbVar9 + 1;
              p->pCur = (char *)pbVar9;
              if (pbVar9 == pbVar11) goto LAB_00331de8;
            }
            pbVar9 = pbVar9 + 1;
            goto LAB_00331a0d;
          }
        }
        goto LAB_00331de8;
      }
      pbVar9 = pbVar9 + 2;
      p->pCur = (char *)pbVar9;
      if (pbVar11 <= pbVar9) goto LAB_00331de8;
      while ((*pbVar9 != 0x2a || (pbVar9[1] != 0x2f))) {
        pbVar9 = pbVar9 + 1;
        p->pCur = (char *)pbVar9;
        if (pbVar9 == pbVar11) goto LAB_00331de8;
      }
      pbVar9 = pbVar9 + 2;
LAB_00331a0d:
      p->pCur = (char *)pbVar9;
    } while( true );
  }
LAB_00331796:
  if (p->ErrorStr[0] == '\0') {
    builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
    if (p->ErrorStr[0] == '\0') {
      uVar13._0_1_ = ' ';
      uVar13._1_1_ = '8';
      uVar13._2_1_ = '.';
      uVar13._3_1_ = '\0';
LAB_003317e0:
      p->ErrorStr[0] = 'E';
      p->ErrorStr[1] = 'r';
      p->ErrorStr[2] = 'r';
      p->ErrorStr[3] = 'o';
      p->ErrorStr[4] = 'r';
      p->ErrorStr[5] = ' ';
      p->ErrorStr[6] = 'n';
      p->ErrorStr[7] = 'u';
      p->ErrorStr[8] = 'm';
      p->ErrorStr[9] = 'b';
      p->ErrorStr[10] = 'e';
      p->ErrorStr[0xb] = 'r';
      *(undefined4 *)(p->ErrorStr + 0xc) = uVar13;
      return 0;
    }
  }
LAB_00331e98:
  __assert_fail("!p->ErrorStr[0]",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacPrs.h"
                ,0x9d,"int Psr_ManErrorSet(Psr_Man_t *, char *, int)");
LAB_00331c76:
  Value = (uint)uVar10;
  if (pbVar11 <= pbVar9) goto LAB_00331e59;
  while( true ) {
    uVar10 = (ulong)*pbVar9;
    Value = (uint)*pbVar9;
    if (0x2f < uVar10) {
      return iVar5;
    }
    if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) break;
    pbVar9 = pbVar9 + 1;
    p->pCur = (char *)pbVar9;
  }
  if (uVar10 != 0x2f) {
    if (uVar10 != 0) {
      return iVar5;
    }
    goto LAB_00331e59;
  }
  bVar3 = pbVar9[1];
  uVar10 = (ulong)bVar3;
  if (bVar3 == 0x2a) {
    pbVar9 = pbVar9 + 2;
    p->pCur = (char *)pbVar9;
    if (pbVar11 <= pbVar9) {
      return iVar5;
    }
    while ((*pbVar9 != 0x2a || (pbVar9[1] != 0x2f))) {
      pbVar9 = pbVar9 + 1;
      p->pCur = (char *)pbVar9;
      if (pbVar9 == pbVar11) {
        return iVar5;
      }
    }
    pbVar9 = pbVar9 + 2;
  }
  else {
    if (bVar3 != 0x2f) {
      return iVar5;
    }
    pbVar9 = pbVar9 + 2;
    p->pCur = (char *)pbVar9;
    if (pbVar11 <= pbVar9) {
      return iVar5;
    }
    while (*pbVar9 != 10) {
      pbVar9 = pbVar9 + 1;
      p->pCur = (char *)pbVar9;
      if (pbVar9 == pbVar11) {
        return iVar5;
      }
    }
    pbVar9 = pbVar9 + 1;
  }
  p->pCur = (char *)pbVar9;
  goto LAB_00331c76;
LAB_00331e59:
  if (p->ErrorStr[0] == '\0') {
    builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
    pcVar12 = "Error number 12.";
LAB_00331e8b:
    Psr_ManErrorSet(p,pcVar12,Value);
    return 0;
  }
  goto LAB_00331e98;
}

Assistant:

static inline int Psr_ManReadSignal( Psr_Man_t * p )
{
    int Item;
    if ( Psr_ManUtilSkipSpaces(p) )         return Psr_ManErrorSet(p, "Error number 8.", 0);
    if ( Psr_ManIsDigit(p) )
    {
        Item = Psr_ManReadConstant(p);
        if ( Item == 0 )                    return Psr_ManErrorSet(p, "Error number 9.", 0);
        if ( Psr_ManUtilSkipSpaces(p) )     return Psr_ManErrorSet(p, "Error number 10.", 0);
        return Abc_Var2Lit2( Item, BAC_PRS_CONST );
    }
    if ( Psr_ManIsChar(p, '{') )
    {
        if ( p->fUsingTemp2 )               return Psr_ManErrorSet(p, "Cannot read nested concatenations.", 0);
        p->fUsingTemp2 = 1;
        Item = Psr_ManReadConcat(p, &p->vTemp2);
        p->fUsingTemp2 = 0;
        if ( Item == 0 )                    return Psr_ManErrorSet(p, "Error number 11.", 0);
        if ( Psr_ManUtilSkipSpaces(p) )     return Psr_ManErrorSet(p, "Error number 12.", 0);
        return Item;
    }
    else
    {
        Item = Psr_ManReadName( p );
        if ( Item == 0 )                    return Psr_ManErrorSet(p, "Error number 13.", 0);    // was        return 1;                
        if ( Psr_ManUtilSkipSpaces(p) )     return Psr_ManErrorSet(p, "Error number 14.", 0);
        if ( Psr_ManIsChar(p, '[') )
        {
            int Range = Psr_ManReadRange(p);
            if ( Range == 0 )               return Psr_ManErrorSet(p, "Error number 15.", 0);
            if ( Psr_ManUtilSkipSpaces(p) ) return Psr_ManErrorSet(p, "Error number 16.", 0);
            return Abc_Var2Lit2( Psr_NtkAddSlice(p->pNtk, Item, Range), BAC_PRS_SLICE );
        }
        return Abc_Var2Lit2( Item, BAC_PRS_NAME );
    }
}